

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

bool __thiscall
leveldb_filterpolicy_t::KeyMayMatch(leveldb_filterpolicy_t *this,Slice *key,Slice *filter)

{
  _func_uint8_t_void_ptr_char_ptr_size_t_char_ptr_size_t *p_Var1;
  void *pvVar2;
  uint8_t uVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  Slice *filter_local;
  Slice *key_local;
  leveldb_filterpolicy_t *this_local;
  
  p_Var1 = this->key_match_;
  pvVar2 = this->state_;
  pcVar4 = leveldb::Slice::data(key);
  sVar5 = leveldb::Slice::size(key);
  pcVar6 = leveldb::Slice::data(filter);
  sVar7 = leveldb::Slice::size(filter);
  uVar3 = (*p_Var1)(pvVar2,pcVar4,sVar5,pcVar6,sVar7);
  return uVar3 != '\0';
}

Assistant:

bool KeyMayMatch(const Slice& key, const Slice& filter) const override {
    return (*key_match_)(state_, key.data(), key.size(), filter.data(),
                         filter.size());
  }